

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

target_ulong
helper_precrq_rs_qh_pw_mips64(target_ulong rs,target_ulong rt,CPUMIPSState_conflict5 *env)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint16_t tempA;
  uint16_t tempB;
  uint16_t tempC;
  uint16_t tempD;
  uint32_t rt0;
  uint32_t rt2;
  uint32_t rs0;
  uint32_t rs2;
  CPUMIPSState_conflict5 *env_local;
  target_ulong rt_local;
  target_ulong rs_local;
  
  uVar1 = mipsdsp_trunc16_sat16_round((int32_t)(rs >> 0x20),env);
  uVar2 = mipsdsp_trunc16_sat16_round((int32_t)rs,env);
  uVar3 = mipsdsp_trunc16_sat16_round((int32_t)(rt >> 0x20),env);
  uVar4 = mipsdsp_trunc16_sat16_round((int32_t)rt,env);
  return (ulong)uVar1 << 0x30 | (ulong)uVar2 << 0x20 | (ulong)uVar3 << 0x10 | (ulong)uVar4;
}

Assistant:

target_ulong helper_precrq_rs_qh_pw(target_ulong rs, target_ulong rt,
                                    CPUMIPSState *env)
{
    uint32_t rs2, rs0;
    uint32_t rt2, rt0;
    uint16_t tempD, tempC, tempB, tempA;

    rs2 = (rs >> 32) & MIPSDSP_LLO;
    rs0 = rs & MIPSDSP_LLO;
    rt2 = (rt >> 32) & MIPSDSP_LLO;
    rt0 = rt & MIPSDSP_LLO;

    tempD = mipsdsp_trunc16_sat16_round(rs2, env);
    tempC = mipsdsp_trunc16_sat16_round(rs0, env);
    tempB = mipsdsp_trunc16_sat16_round(rt2, env);
    tempA = mipsdsp_trunc16_sat16_round(rt0, env);

    return MIPSDSP_RETURN64_16(tempD, tempC, tempB, tempA);
}